

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DialogBox.cpp
# Opt level: O1

void __thiscall
gui::DialogBox::setOptionButton(DialogBox *this,size_t index,shared_ptr<gui::Button> *button)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar2;
  pointer psVar3;
  ulong uVar4;
  long lVar5;
  shared_ptr<gui::Widget> local_50;
  element_type *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  peVar1 = (button->super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    psVar3 = (this->optionButtons_).
             super__Vector_base<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (index < (ulong)((long)(this->optionButtons_).
                              super__Vector_base<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4)) {
      local_50.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &(psVar3[index].super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_Widget;
      local_50.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           psVar3[index].super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      if (local_50.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_50.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_50.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_50.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_50.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      ContainerBase::removeChild((ContainerBase *)this,&local_50);
      if (local_50.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      psVar3 = (this->optionButtons_).
               super__Vector_base<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar3[index].super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      this_00 = psVar3[index].super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      psVar3[index].super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      psVar3 = (this->optionButtons_).
               super__Vector_base<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = (long)(this->optionButtons_).
                    super__Vector_base<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4;
      lVar5 = uVar4 - index;
      if (index <= uVar4 && lVar5 != 0) {
        psVar3 = psVar3 + index;
        do {
          if ((psVar3->super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
              (element_type *)0x0) goto LAB_0018cf30;
          psVar3 = psVar3 + 1;
          lVar5 = lVar5 + -1;
        } while (lVar5 != 0);
      }
      std::vector<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>::
      resize(&this->optionButtons_,index);
    }
  }
  else {
    local_50.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (button->super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_50.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_50.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_50.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_50.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_50.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_50.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &peVar1->super_Widget;
    bVar2 = ContainerBase::hasChild((ContainerBase *)this,&local_50);
    if (local_50.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (!bVar2) {
      local_40 = (button->super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_38 = (button->super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                 _M_pi;
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_38->_M_use_count = local_38->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_38->_M_use_count = local_38->_M_use_count + 1;
        }
      }
      (*(this->super_Group).super_Container.super_ContainerBase._vptr_ContainerBase[2])
                (this,&local_40);
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      }
    }
    if ((ulong)((long)(this->optionButtons_).
                      super__Vector_base<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->optionButtons_).
                      super__Vector_base<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) <= index) {
      std::vector<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>::
      resize(&this->optionButtons_,index + 1);
    }
    psVar3 = (this->optionButtons_).
             super__Vector_base<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>
             ._M_impl.super__Vector_impl_data._M_start + index;
    (psVar3->super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (button->super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(psVar3->super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
               &(button->super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  }
LAB_0018cf30:
  updateButtons(this);
  return;
}

Assistant:

void DialogBox::setOptionButton(size_t index, std::shared_ptr<Button> button) {
    if (button != nullptr) {
        if (!hasChild(button)) {
            addChild(button);
        }
        if (index >= optionButtons_.size()) {
            optionButtons_.resize(index + 1);
        }
        optionButtons_[index] = button;
    } else if (index < optionButtons_.size()) {
        removeChild(optionButtons_[index]);
        optionButtons_[index] = nullptr;
        bool foundButton = false;
        for (size_t i = index; i < optionButtons_.size(); ++i) {
            if (optionButtons_[i] != nullptr) {
                foundButton = true;
                break;
            }
        }
        if (!foundButton) {
            optionButtons_.resize(index);
        }
    }
    updateButtons();
}